

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O0

ngx_rbtree_node_t * ngx_rbtree_next(ngx_rbtree_t *tree,ngx_rbtree_node_t *node)

{
  bool bVar1;
  ngx_rbtree_node_t *parent;
  ngx_rbtree_node_t *sentinel;
  ngx_rbtree_node_t *root;
  ngx_rbtree_node_t *node_local;
  ngx_rbtree_t *tree_local;
  
  if (node->right == tree->sentinel) {
    root = node;
    do {
      tree_local = (ngx_rbtree_t *)root->parent;
      if (root == tree->root) {
        return (ngx_rbtree_node_t *)0x0;
      }
      bVar1 = root != ((ngx_rbtree_node_t *)tree_local)->left;
      root = (ngx_rbtree_node_t *)tree_local;
    } while (bVar1);
  }
  else {
    tree_local = (ngx_rbtree_t *)ngx_rbtree_min(node->right,tree->sentinel);
  }
  return (ngx_rbtree_node_t *)tree_local;
}

Assistant:

ngx_rbtree_node_t *
ngx_rbtree_next(ngx_rbtree_t *tree, ngx_rbtree_node_t *node)
{
    ngx_rbtree_node_t  *root, *sentinel, *parent;

    sentinel = tree->sentinel;

    if (node->right != sentinel) {
        return ngx_rbtree_min(node->right, sentinel);
    }

    root = tree->root;

    for ( ;; ) {
        parent = node->parent;

        if (node == root) {
            return NULL;
        }

        if (node == parent->left) {
            return parent;
        }

        node = parent;
    }
}